

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TMap<FName,_FOptionalMapinfoDataPtr,_THashTraits<FName>,_TValueTraits<FOptionalMapinfoDataPtr>_>::
Resize(TMap<FName,_FOptionalMapinfoDataPtr,_THashTraits<FName>,_TValueTraits<FOptionalMapinfoDataPtr>_>
       *this,hash_t nhsize)

{
  uint uVar1;
  Node *block;
  long *plVar2;
  undefined8 in_RAX;
  Node *pNVar3;
  FOptionalMapinfoData *pFVar4;
  long lVar5;
  undefined8 uStack_38;
  
  uVar1 = this->Size;
  block = this->Nodes;
  uStack_38 = in_RAX;
  SetNodeVector(this,nhsize);
  this->NumUsed = 0;
  if ((ulong)uVar1 != 0) {
    lVar5 = 0;
    do {
      if (*(long *)((long)&block->Next + lVar5) != 1) {
        uStack_38 = CONCAT44(*(undefined4 *)((long)&(block->Pair).Key.Index + lVar5),
                             (undefined4)uStack_38);
        pNVar3 = NewKey(this,(FName *)((long)&uStack_38 + 4));
        pFVar4 = (FOptionalMapinfoData *)
                 (**(code **)(**(long **)((long)&(block->Pair).Value.Ptr + lVar5) + 0x10))();
        (pNVar3->Pair).Value.Ptr = pFVar4;
        plVar2 = *(long **)((long)&(block->Pair).Value.Ptr + lVar5);
        if (plVar2 != (long *)0x0) {
          (**(code **)(*plVar2 + 8))();
        }
      }
      lVar5 = lVar5 + 0x18;
    } while ((ulong)uVar1 * 0x18 != lVar5);
  }
  M_Free(block);
  return;
}

Assistant:

void Resize(hash_t nhsize)
	{
		hash_t i, oldhsize = Size;
		Node *nold = Nodes;
		/* create new hash part with appropriate size */
		SetNodeVector(nhsize);
		/* re-insert elements from hash part */
		NumUsed = 0;
		for (i = 0; i < oldhsize; ++i)
		{
			if (!nold[i].IsNil())
			{
				Node *n = NewKey(nold[i].Pair.Key);
				::new(&n->Pair.Value) VT(nold[i].Pair.Value);
				nold[i].~Node();
			}
		}
		M_Free(nold);
	}